

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall hrgls::datablob::DataBlobSource::~DataBlobSource(DataBlobSource *this)

{
  DataBlobSource_private *this_00;
  DataBlobSource *this_local;
  
  if ((this->m_private != (DataBlobSource_private *)0x0) &&
     (this->m_private->m_stream != (hrgls_DataBlobSource)0x0)) {
    hrgls_DataBlobSourceDestroy(this->m_private->m_stream);
  }
  this_00 = this->m_private;
  if (this_00 != (DataBlobSource_private *)0x0) {
    DataBlobSource_private::~DataBlobSource_private(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

DataBlobSource::~DataBlobSource()
    {
      // Destroy any API object we created.
      if (m_private && m_private->m_stream) {
        hrgls_DataBlobSourceDestroy(m_private->m_stream);
      }
      delete m_private;
    }